

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  undefined8 uStack_50;
  int value;
  nn_symbol_properties sym;
  
  lVar3 = nn_symbol(0xffffffffffffffff,0);
  if (lVar3 == 0) {
    iVar1 = nn_errno();
    if (iVar1 == 0x16) {
      iVar1 = nn_symbol_info(0xffffffffffffffff,&sym,0x20);
      if (iVar1 == 0) {
        lVar3 = nn_symbol(2000,0);
        if (lVar3 == 0) {
          iVar1 = nn_errno();
          if (iVar1 == 0x16) {
            iVar1 = nn_symbol_info(2000,&sym,0x20);
            if (iVar1 == 0) {
              lVar3 = nn_symbol(6,&value);
              if (lVar3 == 0) {
                pcVar4 = "nn_symbol (6, &value) != NULL";
                uStack_50 = 0x27;
              }
              else if (value == 0) {
                pcVar4 = "value != 0";
                uStack_50 = 0x28;
              }
              else {
                iVar1 = nn_symbol_info(6,&sym,0x20);
                if (iVar1 == 0x20) {
                  iVar1 = 0;
                  do {
                    lVar3 = nn_symbol(iVar1,&value);
                    iVar1 = iVar1 + 1;
                  } while (lVar3 != 0);
                  iVar1 = nn_errno();
                  if (iVar1 == 0x16) {
                    iVar1 = 0;
                    do {
                      iVar2 = nn_symbol_info(iVar1,&sym,0x20);
                      iVar1 = iVar1 + 1;
                    } while (iVar2 != 0);
                    return 0;
                  }
                  pcVar4 = "nn_errno () == EINVAL";
                  uStack_50 = 0x2e;
                }
                else {
                  pcVar4 = "nn_symbol_info (6, &sym, (int) sizeof (sym)) == sizeof (sym)";
                  uStack_50 = 0x29;
                }
              }
            }
            else {
              pcVar4 = "nn_symbol_info (2000, &sym, (int) sizeof (sym)) == 0";
              uStack_50 = 0x25;
            }
          }
          else {
            pcVar4 = "nn_errno () == EINVAL";
            uStack_50 = 0x24;
          }
        }
        else {
          pcVar4 = "nn_symbol (2000, NULL) == NULL";
          uStack_50 = 0x23;
        }
      }
      else {
        pcVar4 = "nn_symbol_info (-1, &sym, (int) sizeof (sym)) == 0";
        uStack_50 = 0x21;
      }
    }
    else {
      pcVar4 = "nn_errno () == EINVAL";
      uStack_50 = 0x20;
    }
  }
  else {
    pcVar4 = "nn_symbol (-1, NULL) == NULL";
    uStack_50 = 0x1f;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar4,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/symbol.c",
          uStack_50);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int main ()
{
    int i;
    struct nn_symbol_properties sym;
    int value;

    nn_assert (nn_symbol (-1, NULL) == NULL);
    nn_assert (nn_errno () == EINVAL);
    nn_assert (nn_symbol_info (-1, &sym, (int) sizeof (sym)) == 0);

    nn_assert (nn_symbol (2000, NULL) == NULL);
    nn_assert (nn_errno () == EINVAL);
    nn_assert (nn_symbol_info (2000, &sym, (int) sizeof (sym)) == 0);

    nn_assert (nn_symbol (6, &value) != NULL);
    nn_assert (value != 0);
    nn_assert (nn_symbol_info (6, &sym, (int) sizeof (sym)) == sizeof (sym));

    for (i = 0; ; ++i) {
        const char* name = nn_symbol (i, &value);
        if (name == NULL) {
            nn_assert (nn_errno () == EINVAL);
            break;
        }
    }

    for (i = 0; ; ++i) {
        if (nn_symbol_info (i, &sym, sizeof (sym)) == 0)
            break;
    }

    return 0;
}